

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

void thanm_instr_free(thanm_instr_t *instr)

{
  list_node_t *plVar1;
  
  plVar1 = (list_node_t *)&instr->params;
  while (plVar1 = plVar1->next, plVar1 != (list_node_t *)0x0) {
    thanm_param_free((thanm_param_t *)plVar1->data);
  }
  list_free_nodes(&instr->params);
  free(instr);
  return;
}

Assistant:

static void
thanm_instr_free(
    thanm_instr_t* instr
) {
    thanm_param_t* param;
    list_for_each(&instr->params, param)
        thanm_param_free(param);
    list_free_nodes(&instr->params);

    free(instr);
}